

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

int Kit_TruthVarIsVacuous(uint *pOnset,uint *pOffset,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int local_34;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pOffset_local;
  uint *pOnset_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x276,"int Kit_TruthVarIsVacuous(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if (((pOnset[Step] & pOffset[Step] >> 1 | pOffset[Step] & pOnset[Step] >> 1) & 0x55555555) !=
          0) {
        return 0;
      }
    }
    break;
  case 1:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if (((pOnset[Step] & pOffset[Step] >> 2 | pOffset[Step] & pOnset[Step] >> 2) & 0x33333333) !=
          0) {
        return 0;
      }
    }
    break;
  case 2:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if (((pOnset[Step] & pOffset[Step] >> 4 | pOffset[Step] & pOnset[Step] >> 4) & 0xf0f0f0f) != 0
         ) {
        return 0;
      }
    }
    break;
  case 3:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if (((pOnset[Step] & pOffset[Step] >> 8 | pOffset[Step] & pOnset[Step] >> 8) & 0xff00ff) != 0)
      {
        return 0;
      }
    }
    break;
  case 4:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if ((pOnset[Step] & pOffset[Step] >> 0x10) != 0 || (pOffset[Step] & pOnset[Step] >> 0x10) != 0
         ) {
        return 0;
      }
    }
    break;
  default:
    iVar2 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pOffset;
    pOffset_local = pOnset;
    for (local_34 = 0; local_34 < iVar1; local_34 = iVar2 * 2 + local_34) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        if ((pOffset_local[Step] & _iVar_local[iVar2 + Step]) != 0 ||
            (_iVar_local[Step] & pOffset_local[iVar2 + Step]) != 0) {
          return 0;
        }
      }
      pOffset_local = pOffset_local + (iVar2 << 1);
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
  }
  return 1;
}

Assistant:

int Kit_TruthVarIsVacuous( unsigned * pOnset, unsigned * pOffset, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 1)) | (pOffset[i] & (pOnset[i] >> 1))) & 0x55555555 )
                 return 0;
        return 1;
    case 1:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 2)) | (pOffset[i] & (pOnset[i] >> 2))) & 0x33333333 )
                 return 0;
            return 1;
    case 2:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 4)) | (pOffset[i] & (pOnset[i] >> 4))) & 0x0F0F0F0F )
                 return 0;
        return 1;
    case 3:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 8)) | (pOffset[i] & (pOnset[i] >> 8))) & 0x00FF00FF )
                 return 0;
        return 1;
    case 4:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 16)) | (pOffset[i] & (pOnset[i] >> 16))) & 0x0000FFFF )
                 return 0;
        return 1;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( (pOnset[i] & pOffset[Step+i]) | (pOffset[i] & pOnset[Step+i]) )
                     return 0;
            pOnset += 2*Step;
            pOffset += 2*Step;
        }
        return 1;
    }
}